

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O3

Instr * __thiscall FlowGraph::PeepCm(FlowGraph *this,Instr *instr)

{
  ValueType *pVVar1;
  Instr **ppIVar2;
  byte bVar3;
  OpCode OVar4;
  uint32 origBranchSrcSymId;
  Func *pFVar5;
  code *pcVar6;
  undefined8 src1Opnd;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  OpndKind OVar10;
  OpCode OVar11;
  int iVar12;
  RegSlot RVar13;
  uint32 uVar14;
  uint32 uVar15;
  BranchInstr *this_00;
  BranchInstr *this_01;
  BranchInstr *pBVar16;
  StackSym *pSVar17;
  Opnd *pOVar18;
  undefined4 *puVar19;
  undefined4 extraout_var;
  AddrOpnd *this_02;
  undefined4 extraout_var_00;
  Instr *pIVar20;
  Instr *this_03;
  Instr *this_04;
  RegOpnd *pRVar21;
  LabelInstr *labelInstr;
  Func *pFVar22;
  AddrOpnd *src1Opnd_00;
  char *this_05;
  Instr *inlineeEndInstr;
  undefined1 local_b8 [8];
  AutoReuseOpnd brSrcAutoCopy;
  Func *local_90;
  BranchInstr *local_70;
  uint32 local_5c;
  Opnd *local_58;
  BranchInstr *local_50;
  BranchInstr *local_48;
  BranchInstr *local_38;
  
  pFVar22 = instr->m_func;
  this_00 = (BranchInstr *)IR::Instr::GetNextRealInstrOrLabel(instr);
  local_58 = instr->m_dst;
  if (((this_00->super_Instr).m_opcode == Ld_A) &&
     (bVar7 = IR::Opnd::IsEqual((this_00->super_Instr).m_src1,local_58), bVar7)) {
    local_58 = (this_00->super_Instr).m_dst;
    bVar7 = IR::Opnd::IsEqual(local_58,instr->m_src1);
    if (bVar7) {
      return (Instr *)0x0;
    }
    bVar7 = IR::Opnd::IsEqual(local_58,instr->m_src2);
    if (bVar7) {
      return (Instr *)0x0;
    }
    this_01 = (BranchInstr *)IR::Instr::GetNextRealInstrOrLabel((Instr *)this_00);
    bVar7 = true;
    local_48 = this_00;
    if (((this_01->super_Instr).m_opcode == Ld_A) &&
       (bVar8 = IR::Opnd::IsEqual((this_01->super_Instr).m_src1,local_58), bVar8)) {
      local_58 = (this_01->super_Instr).m_dst;
      pBVar16 = (BranchInstr *)IR::Instr::GetNextRealInstrOrLabel((Instr *)this_01);
      bVar8 = IR::Opnd::IsEqual(local_58,instr->m_src1);
      if (bVar8) {
        return (Instr *)0x0;
      }
      bVar8 = IR::Opnd::IsEqual(local_58,instr->m_src2);
      local_50 = this_01;
      if (bVar8) {
        return (Instr *)0x0;
      }
    }
    else {
      local_50 = (BranchInstr *)0x0;
      pBVar16 = this_01;
    }
  }
  else {
    bVar7 = false;
    local_50 = (BranchInstr *)0x0;
    local_48 = (BranchInstr *)0x0;
    pBVar16 = this_00;
  }
  OVar4 = (pBVar16->super_Instr).m_opcode;
  if (OVar4 == InlineeEnd) {
    local_38 = (BranchInstr *)IR::Instr::GetNextRealInstrOrLabel(&pBVar16->super_Instr);
    OVar4 = (local_38->super_Instr).m_opcode;
    local_70 = pBVar16;
  }
  else {
    local_70 = (BranchInstr *)0x0;
    local_38 = pBVar16;
  }
  if (((OVar4 & ~ExtendedOpcodePrefix) != BrFalse_A) ||
     ((bVar8 = IR::Opnd::IsEqual(instr->m_dst,(local_38->super_Instr).m_src1), !bVar8 &&
      (bVar8 = IR::Opnd::IsEqual(local_58,(local_38->super_Instr).m_src1), !bVar8)))) {
    return (Instr *)0x0;
  }
  local_90 = (local_38->super_Instr).m_func;
  local_5c = IR::Instr::GetByteCodeOffset(&local_38->super_Instr);
  pSVar17 = IR::Opnd::GetStackSym((local_38->super_Instr).m_src1);
  origBranchSrcSymId = (pSVar17->super_Sym).m_id;
  bVar3 = ((local_38->super_Instr).m_src1)->field_0xb;
  IR::Instr::Unlink(&local_38->super_Instr);
  IR::Instr::InsertBefore(instr,&local_38->super_Instr);
  IR::Instr::ClearByteCodeOffset(&local_38->super_Instr);
  IR::Instr::SetByteCodeOffset(&local_38->super_Instr,instr);
  IR::Instr::FreeSrc1(&local_38->super_Instr);
  pOVar18 = IR::Instr::UnlinkSrc1(instr);
  if ((local_38->super_Instr).m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar19 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar8) goto LAB_00414959;
    *puVar19 = 0;
  }
  pFVar5 = (local_38->super_Instr).m_func;
  if (pOVar18->isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar19 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar8) goto LAB_00414959;
    *puVar19 = 0;
  }
  bVar9 = pOVar18->field_0xb;
  if ((bVar9 & 2) != 0) {
    pOVar18 = IR::Opnd::Copy(pOVar18,pFVar5);
    bVar9 = pOVar18->field_0xb;
  }
  pOVar18->field_0xb = bVar9 | 2;
  (local_38->super_Instr).m_src1 = pOVar18;
  pOVar18 = IR::Instr::UnlinkSrc2(instr);
  if ((local_38->super_Instr).m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar19 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
    if (!bVar8) goto LAB_00414959;
    *puVar19 = 0;
  }
  pFVar5 = (local_38->super_Instr).m_func;
  if (pOVar18->isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar19 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar8) goto LAB_00414959;
    *puVar19 = 0;
  }
  bVar9 = pOVar18->field_0xb;
  if ((bVar9 & 2) != 0) {
    pOVar18 = IR::Opnd::Copy(pOVar18,pFVar5);
    bVar9 = pOVar18->field_0xb;
  }
  pOVar18->field_0xb = bVar9 | 2;
  (local_38->super_Instr).m_src2 = pOVar18;
  (local_38->super_Instr).m_func = instr->m_func;
  switch(instr->m_opcode) {
  case CmEq_A:
    OVar11 = BrEq_A;
    break;
  case CmGe_A:
    OVar11 = BrGe_A;
    break;
  case CmGt_A:
    OVar11 = BrGt_A;
    break;
  case CmLt_A:
    OVar11 = BrLt_A;
    break;
  case CmLe_A:
    OVar11 = BrLe_A;
    break;
  case CmNeq_A:
    OVar11 = BrNeq_A;
    break;
  case CmSrEq_A:
    OVar11 = BrSrEq_A;
    break;
  case CmSrNeq_A:
    OVar11 = BrSrNeq_A;
    break;
  default:
    switch(instr->m_opcode) {
    case CmUnGe_A:
      OVar11 = BrUnGe_A;
      break;
    case CmUnGt_A:
      OVar11 = BrUnGt_A;
      break;
    case CmUnLt_A:
      OVar11 = BrUnLt_A;
      break;
    case CmUnLe_A:
      OVar11 = BrUnLe_A;
      break;
    default:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar19 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0xb20,"((0))","UNREACHED");
      if (!bVar8) goto LAB_00414959;
      *puVar19 = 0;
      OVar11 = InvalidOpCode;
    }
  }
  (local_38->super_Instr).m_opcode = OVar11;
  iVar12 = (*pFVar22->m_scriptContextInfo->_vptr_ScriptContextInfo[2])();
  this_02 = IR::AddrOpnd::New(CONCAT44(extraout_var,iVar12),AddrOpndKindDynamicVar,pFVar22,true,
                              (Var)0x0);
  iVar12 = (*pFVar22->m_scriptContextInfo->_vptr_ScriptContextInfo[3])();
  pBVar16 = (BranchInstr *)
            IR::AddrOpnd::New(CONCAT44(extraout_var_00,iVar12),AddrOpndKindDynamicVar,pFVar22,true,
                              (Var)0x0);
  IR::Opnd::SetValueType(&this_02->super_Opnd,(ValueType)0x400);
  this_05 = (char *)pBVar16;
  IR::Opnd::SetValueType((Opnd *)pBVar16,(ValueType)0x400);
  brSrcAutoCopy._16_8_ = pBVar16;
  if (OVar4 == BrTrue_A) {
    if (bVar7) {
      pIVar20 = IR::Instr::New(Ld_A,(local_48->super_Instr).m_src1,&this_02->super_Opnd,
                               (local_38->super_Instr).m_func);
      IR::Instr::SetByteCodeOffset(pIVar20,&local_38->super_Instr);
      pOVar18 = pIVar20->m_dst;
      OVar10 = IR::Opnd::GetKind(pOVar18);
      if (OVar10 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar19 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar7) goto LAB_00414959;
        *puVar19 = 0;
      }
      pVVar1 = &pOVar18[1].m_valueType;
      *(byte *)&pVVar1->field_0 = *(byte *)&pVVar1->field_0 | 8;
      IR::Instr::InsertBefore(&local_38->super_Instr,pIVar20);
      pIVar20 = IR::Instr::New(Ld_A,(local_48->super_Instr).m_dst,&this_02->super_Opnd,
                               (local_38->super_Instr).m_func);
      IR::Instr::SetByteCodeOffset(pIVar20,&local_38->super_Instr);
      pOVar18 = pIVar20->m_dst;
      OVar10 = IR::Opnd::GetKind(pOVar18);
      if (OVar10 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar19 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar7) goto LAB_00414959;
        *puVar19 = 0;
      }
      pVVar1 = &pOVar18[1].m_valueType;
      *(byte *)&pVVar1->field_0 = *(byte *)&pVVar1->field_0 | 8;
      IR::Instr::InsertBefore(&local_38->super_Instr,pIVar20);
      pIVar20 = IR::Instr::New(Ld_A,(local_48->super_Instr).m_src1,(Opnd *)pBVar16,
                               (local_48->super_Instr).m_func);
      IR::Instr::InsertBefore(&local_48->super_Instr,pIVar20);
      IR::Instr::SetByteCodeOffset(pIVar20,&local_48->super_Instr);
      pOVar18 = pIVar20->m_dst;
      OVar10 = IR::Opnd::GetKind(pOVar18);
      if (OVar10 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar19 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar7) goto LAB_00414959;
        *puVar19 = 0;
      }
      pVVar1 = &pOVar18[1].m_valueType;
      *(byte *)&pVVar1->field_0 = *(byte *)&pVVar1->field_0 | 8;
      IR::Instr::ReplaceSrc1(&local_48->super_Instr,(Opnd *)pBVar16);
      this_05 = (char *)local_48;
      if (local_50 != (BranchInstr *)0x0) {
        IR::Instr::ReplaceSrc1(&local_50->super_Instr,(Opnd *)pBVar16);
        pOVar18 = (local_50->super_Instr).m_dst;
        pFVar22 = (local_38->super_Instr).m_func;
        src1Opnd_00 = this_02;
LAB_004142b5:
        pIVar20 = IR::Instr::New(Ld_A,pOVar18,&src1Opnd_00->super_Opnd,pFVar22);
        IR::Instr::InsertBefore(&local_38->super_Instr,pIVar20);
        IR::Instr::SetByteCodeOffset(pIVar20,&local_38->super_Instr);
        pBVar16 = (BranchInstr *)pIVar20->m_dst;
        this_05 = (char *)pBVar16;
        OVar10 = IR::Opnd::GetKind((Opnd *)pBVar16);
        if (OVar10 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar19 = 1;
          this_05 = 
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
          ;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar7) goto LAB_00414959;
          *puVar19 = 0;
        }
        ppIVar2 = &(pBVar16->super_Instr).m_prev;
        *(byte *)ppIVar2 = *(byte *)ppIVar2 | 8;
      }
    }
  }
  else {
    if ((local_38->super_Instr).m_kind != InstrKindBranch) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar19 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
      if (!bVar8) goto LAB_00414959;
      *puVar19 = 0;
    }
    this_05 = (char *)local_38;
    IR::BranchInstr::Invert(local_38);
    if (bVar7) {
      pIVar20 = IR::Instr::New(Ld_A,(local_48->super_Instr).m_src1,(Opnd *)pBVar16,
                               (local_38->super_Instr).m_func);
      IR::Instr::InsertBefore(&local_38->super_Instr,pIVar20);
      IR::Instr::SetByteCodeOffset(pIVar20,&local_38->super_Instr);
      pOVar18 = pIVar20->m_dst;
      OVar10 = IR::Opnd::GetKind(pOVar18);
      if (OVar10 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar19 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar7) goto LAB_00414959;
        *puVar19 = 0;
      }
      pVVar1 = &pOVar18[1].m_valueType;
      *(byte *)&pVVar1->field_0 = *(byte *)&pVVar1->field_0 | 8;
      pIVar20 = IR::Instr::New(Ld_A,(local_48->super_Instr).m_dst,(Opnd *)pBVar16,
                               (local_38->super_Instr).m_func);
      IR::Instr::InsertBefore(&local_38->super_Instr,pIVar20);
      IR::Instr::SetByteCodeOffset(pIVar20,&local_38->super_Instr);
      pOVar18 = pIVar20->m_dst;
      OVar10 = IR::Opnd::GetKind(pOVar18);
      if (OVar10 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar19 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar7) goto LAB_00414959;
        *puVar19 = 0;
      }
      pVVar1 = &pOVar18[1].m_valueType;
      *(byte *)&pVVar1->field_0 = *(byte *)&pVVar1->field_0 | 8;
      pIVar20 = IR::Instr::New(Ld_A,(local_48->super_Instr).m_src1,&this_02->super_Opnd,
                               (local_48->super_Instr).m_func);
      IR::Instr::InsertBefore(&local_48->super_Instr,pIVar20);
      IR::Instr::SetByteCodeOffset(pIVar20,&local_48->super_Instr);
      IR::Instr::ReplaceSrc1(&local_48->super_Instr,&this_02->super_Opnd);
      pBVar16 = (BranchInstr *)pIVar20->m_dst;
      this_05 = (char *)pBVar16;
      OVar10 = IR::Opnd::GetKind((Opnd *)pBVar16);
      if (OVar10 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar19 = 1;
        this_05 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
        ;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar7) goto LAB_00414959;
        *puVar19 = 0;
      }
      src1Opnd_00 = (AddrOpnd *)brSrcAutoCopy._16_8_;
      ppIVar2 = &(pBVar16->super_Instr).m_prev;
      *(byte *)ppIVar2 = *(byte *)ppIVar2 | 8;
      if (local_50 != (BranchInstr *)0x0) {
        IR::Instr::ReplaceSrc1(&local_50->super_Instr,&this_02->super_Opnd);
        pOVar18 = (local_50->super_Instr).m_dst;
        pFVar22 = (local_38->super_Instr).m_func;
        goto LAB_004142b5;
      }
    }
  }
  if (local_70 != (BranchInstr *)0x0) {
    if ((local_38->super_Instr).m_kind != InstrKindBranch) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar19 = 1;
      this_05 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
      ;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
      if (!bVar7) goto LAB_00414959;
      *puVar19 = 0;
    }
    InsertInlineeOnFLowEdge
              ((FlowGraph *)this_05,local_38,&local_70->super_Instr,(Instr *)this_00,local_90,
               local_5c,(bool)((bVar3 & 8) >> 3),origBranchSrcSymId);
  }
  pOVar18 = instr->m_dst;
  OVar10 = IR::Opnd::GetKind(pOVar18);
  if (OVar10 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar19 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar7) goto LAB_00414959;
    *puVar19 = 0;
  }
  if ((*(byte *)((long)pOVar18[1]._vptr_Opnd + 0x19) & 0x20) != 0) {
    if ((local_38->super_Instr).m_kind != InstrKindBranch) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar19 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
      if (!bVar7) goto LAB_00414959;
      *puVar19 = 0;
    }
    if (local_38->m_byteCodeReg != 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar19 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0xb73,"(!instrBr->AsBranchInstr()->HasByteCodeReg())",
                         "!instrBr->AsBranchInstr()->HasByteCodeReg()");
      if (!bVar7) goto LAB_00414959;
      *puVar19 = 0;
    }
    pOVar18 = instr->m_dst;
    OVar10 = IR::Opnd::GetKind(pOVar18);
    if (OVar10 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar19 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar7) goto LAB_00414959;
      *puVar19 = 0;
    }
    pSVar17 = (StackSym *)pOVar18[1]._vptr_Opnd;
    if ((local_38->super_Instr).m_kind != InstrKindBranch) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar19 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
      if (!bVar7) goto LAB_00414959;
      *puVar19 = 0;
    }
    RVar13 = StackSym::GetByteCodeRegSlot(pSVar17);
    local_38->m_byteCodeReg = RVar13;
  }
  pOVar18 = IR::Opnd::Copy(local_58,this->func);
  local_b8 = (undefined1  [8])0x0;
  IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)local_b8,pOVar18,this->func,true);
  IR::Instr::Remove(instr);
  if ((local_38->super_Instr).m_kind != InstrKindBranch) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar19 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
    if (!bVar7) {
LAB_00414959:
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    *puVar19 = 0;
  }
  pIVar20 = IR::Instr::GetNextRealInstrOrLabel(&local_38->m_branchTarget->super_Instr);
  puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  for (; pIVar20->m_opcode == Br; pIVar20 = IR::Instr::GetNextRealInstrOrLabel(pIVar20[1].m_next)) {
    if (pIVar20->m_kind != InstrKindBranch) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar19 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
      if (!bVar7) goto LAB_00414959;
      *puVar19 = 0;
    }
  }
  if (pIVar20->m_opcode != Ld_A) goto LAB_004147ae;
  this_03 = IR::Instr::GetNextRealInstrOrLabel(pIVar20);
  src1Opnd = brSrcAutoCopy._16_8_;
  OVar11 = this_03->m_opcode;
  if ((local_70 == (BranchInstr *)0x0) && (OVar11 == InlineeEnd)) {
    this_04 = IR::Instr::GetNextRealInstrOrLabel(this_03);
    OVar11 = this_04->m_opcode;
    inlineeEndInstr = this_03;
  }
  else {
    inlineeEndInstr = (Instr *)0x0;
    this_04 = this_03;
  }
  if (((((OVar11 & ~ExtendedOpcodePrefix) != BrFalse_A) ||
       (bVar7 = IR::Opnd::IsEqual(pIVar20->m_dst,this_04->m_src1), !bVar7)) ||
      (bVar7 = IR::Opnd::IsEqual(pOVar18,pIVar20->m_src1), !bVar7)) ||
     ((bVar7 = IR::Opnd::IsEqual(pIVar20->m_dst,(local_38->super_Instr).m_src1), bVar7 ||
      (bVar7 = IR::Opnd::IsEqual(pIVar20->m_dst,(local_38->super_Instr).m_src2), bVar7)))) {
LAB_004147a6:
    local_38 = (BranchInstr *)0x0;
  }
  else {
    uVar14 = IR::Instr::GetByteCodeOffset(pIVar20);
    uVar15 = IR::Instr::GetByteCodeOffset(&local_38->super_Instr);
    if (uVar15 < uVar14) {
      pRVar21 = IR::Opnd::AsRegOpnd(pIVar20->m_dst);
      bVar7 = IR::Instr::HasSymUseInRange(pRVar21->m_sym,(local_38->super_Instr).m_next,pIVar20);
      if (bVar7) goto LAB_004147a6;
    }
    if (inlineeEndInstr != (Instr *)0x0) {
      local_90 = this_04->m_func;
      local_5c = IR::Instr::GetByteCodeOffset(this_04);
      pSVar17 = IR::Opnd::GetStackSym(this_04->m_src1);
      origBranchSrcSymId = (pSVar17->super_Sym).m_id;
    }
    pFVar22 = (local_38->super_Instr).m_func;
    if (OVar4 == BrTrue_A) {
      pIVar20 = IR::Instr::New(Ld_A,pIVar20->m_dst,&this_02->super_Opnd,pFVar22);
      IR::Instr::InsertBefore(&local_38->super_Instr,pIVar20);
      IR::Instr::SetByteCodeOffset(pIVar20,&local_38->super_Instr);
    }
    else {
      pIVar20 = IR::Instr::New(Ld_A,pIVar20->m_dst,(Opnd *)src1Opnd,pFVar22);
      IR::Instr::InsertBefore(&local_38->super_Instr,pIVar20);
      IR::Instr::SetByteCodeOffset(pIVar20,&local_38->super_Instr);
    }
    pRVar21 = IR::Opnd::AsRegOpnd(pIVar20->m_dst);
    pRVar21->field_0x18 = pRVar21->field_0x18 | 8;
    if ((OVar4 == BrTrue_A) == (OVar11 == BrTrue_A)) {
      pBVar16 = IR::Instr::AsBranchInstr(this_04);
      labelInstr = pBVar16->m_branchTarget;
    }
    else {
      labelInstr = IR::LabelInstr::New(Label,this_04->m_func,false);
      IR::Instr::SetByteCodeOffset(&labelInstr->super_Instr,this_04->m_next);
      IR::Instr::InsertAfter(this_04,&labelInstr->super_Instr);
    }
    pBVar16 = IR::Instr::AsBranchInstr(&local_38->super_Instr);
    IR::BranchInstr::SetTarget(pBVar16,labelInstr);
    if (inlineeEndInstr != (Instr *)0x0) {
      pBVar16 = IR::Instr::AsBranchInstr(&local_38->super_Instr);
      bVar7 = (bool)((bVar3 & 8) >> 3);
      InsertInlineeOnFLowEdge
                ((FlowGraph *)(ulong)bVar7,pBVar16,inlineeEndInstr,(Instr *)this_00,local_90,
                 local_5c,bVar7,origBranchSrcSymId);
    }
  }
LAB_004147ae:
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_b8);
  return &local_38->super_Instr;
}

Assistant:

IR::Instr *
FlowGraph::PeepCm(IR::Instr *instr)
{
    // Basic pattern, peep:
    //      t1 = CmEq a, b
    //      t2 = Ld_A t1
    //      BrTrue $L1, t2
    // Into:
    //      t1 = True
    //      t2 = True
    //      BrEq $L1, a, b
    //      t1 = False
    //      t2 = False
    //
    //  The true/false Ld_A's will most likely end up being dead-stores...

    //  Alternate Pattern
    //      t1= CmEq a, b
    //      BrTrue $L1, t1
    // Into:
    //      BrEq $L1, a, b

    Func *func = instr->m_func;

    // Find Ld_A
    IR::Instr *instrNext = instr->GetNextRealInstrOrLabel();
    IR::Instr *inlineeEndInstr = nullptr;
    IR::Instr *instrNew;
    IR::Instr *instrLd = nullptr, *instrLd2 = nullptr;
    IR::Instr *instrByteCode = instrNext;
    bool ldFound = false;
    IR::Opnd *brSrc = instr->GetDst();

    if (instrNext->m_opcode == Js::OpCode::Ld_A && instrNext->GetSrc1()->IsEqual(instr->GetDst()))
    {
        ldFound = true;
        instrLd = instrNext;
        brSrc = instrNext->GetDst();

        if (brSrc->IsEqual(instr->GetSrc1()) || brSrc->IsEqual(instr->GetSrc2()))
        {
            return nullptr;
        }

        instrNext = instrLd->GetNextRealInstrOrLabel();

        // Is there a second Ld_A?
        if (instrNext->m_opcode == Js::OpCode::Ld_A && instrNext->GetSrc1()->IsEqual(brSrc))
        {
            // We have:
            //      t1 = Cm
            //      t2 = t1     // ldSrc = t1
            //      t3 = t2     // ldDst = t3
            //      BrTrue/BrFalse t3

            instrLd2 = instrNext;
            brSrc = instrLd2->GetDst();
            instrNext = instrLd2->GetNextRealInstrOrLabel();
            if (brSrc->IsEqual(instr->GetSrc1()) || brSrc->IsEqual(instr->GetSrc2()))
            {
                return nullptr;
            }
        }
    }

    // Skip over InlineeEnd
    if (instrNext->m_opcode == Js::OpCode::InlineeEnd)
    {
        inlineeEndInstr = instrNext;
        instrNext = inlineeEndInstr->GetNextRealInstrOrLabel();
    }

    // Find BrTrue/BrFalse
    bool brIsTrue;
    if (instrNext->m_opcode == Js::OpCode::BrTrue_A)
    {
        brIsTrue = true;
    }
    else if (instrNext->m_opcode == Js::OpCode::BrFalse_A)
    {
        brIsTrue = false;
    }
    else
    {
        return nullptr;
    }

    IR::Instr *instrBr = instrNext;

    // Make sure we have:
    //      t1 = Ld_A
    //         BrTrue/BrFalse t1
    if (!instr->GetDst()->IsEqual(instrBr->GetSrc1()) && !brSrc->IsEqual(instrBr->GetSrc1()))
    {
        return nullptr;
    }

    //
    // We have a match.  Generate the new branch
    //

    // BrTrue/BrFalse t1
    // Keep a copy of the inliner func and the bytecode offset of the original BrTrue/BrFalse if we end up inserting a new branch out of the inlinee,
    // and sym id of t1 for proper restoration on a bailout before the branch.
    Func* origBrFunc = instrBr->m_func;
    uint32 origBrByteCodeOffset = instrBr->GetByteCodeOffset();
    uint32 origBranchSrcSymId = instrBr->GetSrc1()->GetStackSym()->m_id;
    bool origBranchSrcOpndIsJITOpt = instrBr->GetSrc1()->GetIsJITOptimizedReg();

    instrBr->Unlink();
    instr->InsertBefore(instrBr);
    instrBr->ClearByteCodeOffset();
    instrBr->SetByteCodeOffset(instr);
    instrBr->FreeSrc1();
    instrBr->SetSrc1(instr->UnlinkSrc1());
    instrBr->SetSrc2(instr->UnlinkSrc2());
    instrBr->m_func = instr->m_func;

    Js::OpCode newOpcode = Js::OpCode::InvalidOpCode;

    switch(instr->m_opcode)
    {
    case Js::OpCode::CmEq_A:
        newOpcode = Js::OpCode::BrEq_A;
        break;
    case Js::OpCode::CmGe_A:
        newOpcode = Js::OpCode::BrGe_A;
        break;
    case Js::OpCode::CmGt_A:
        newOpcode = Js::OpCode::BrGt_A;
        break;
    case Js::OpCode::CmLt_A:
        newOpcode = Js::OpCode::BrLt_A;
        break;
    case Js::OpCode::CmLe_A:
        newOpcode = Js::OpCode::BrLe_A;
        break;
    case Js::OpCode::CmUnGe_A:
        newOpcode = Js::OpCode::BrUnGe_A;
        break;
    case Js::OpCode::CmUnGt_A:
        newOpcode = Js::OpCode::BrUnGt_A;
        break;
    case Js::OpCode::CmUnLt_A:
        newOpcode = Js::OpCode::BrUnLt_A;
        break;
    case Js::OpCode::CmUnLe_A:
        newOpcode = Js::OpCode::BrUnLe_A;
        break;
    case Js::OpCode::CmNeq_A:
        newOpcode = Js::OpCode::BrNeq_A;
        break;
    case Js::OpCode::CmSrEq_A:
        newOpcode = Js::OpCode::BrSrEq_A;
        break;
    case Js::OpCode::CmSrNeq_A:
        newOpcode = Js::OpCode::BrSrNeq_A;
        break;
    default:
        Assert(UNREACHED);
        __assume(UNREACHED);
    }

    instrBr->m_opcode = newOpcode;

    IR::AddrOpnd* trueOpnd = IR::AddrOpnd::New(func->GetScriptContextInfo()->GetTrueAddr(), IR::AddrOpndKindDynamicVar, func, true);
    IR::AddrOpnd* falseOpnd = IR::AddrOpnd::New(func->GetScriptContextInfo()->GetFalseAddr(), IR::AddrOpndKindDynamicVar, func, true);

    trueOpnd->SetValueType(ValueType::Boolean);
    falseOpnd->SetValueType(ValueType::Boolean);

    if (!brIsTrue)
    {
        instrBr->AsBranchInstr()->Invert();
    }

    if (ldFound)
    {
        // Split Ld_A into "Ld_A TRUE"/"Ld_A FALSE"
        if (brIsTrue)
        {
            instrNew = IR::Instr::New(Js::OpCode::Ld_A, instrLd->GetSrc1(), trueOpnd, instrBr->m_func);
            instrNew->SetByteCodeOffset(instrBr);
            instrNew->GetDst()->AsRegOpnd()->m_fgPeepTmp = true;
            instrBr->InsertBefore(instrNew);
            instrNew = IR::Instr::New(Js::OpCode::Ld_A, instrLd->GetDst(), trueOpnd, instrBr->m_func);
            instrNew->SetByteCodeOffset(instrBr);
            instrNew->GetDst()->AsRegOpnd()->m_fgPeepTmp = true;
            instrBr->InsertBefore(instrNew);

            instrNew = IR::Instr::New(Js::OpCode::Ld_A, instrLd->GetSrc1(), falseOpnd, instrLd->m_func);
            instrLd->InsertBefore(instrNew);
            instrNew->SetByteCodeOffset(instrLd);
            instrNew->GetDst()->AsRegOpnd()->m_fgPeepTmp = true;
            instrLd->ReplaceSrc1(falseOpnd);

            if (instrLd2)
            {
                instrLd2->ReplaceSrc1(falseOpnd);

                instrNew = IR::Instr::New(Js::OpCode::Ld_A, instrLd2->GetDst(), trueOpnd, instrBr->m_func);
                instrBr->InsertBefore(instrNew);
                instrNew->SetByteCodeOffset(instrBr);
                instrNew->GetDst()->AsRegOpnd()->m_fgPeepTmp = true;
            }
        }
        else
        {
            instrNew = IR::Instr::New(Js::OpCode::Ld_A, instrLd->GetSrc1(), falseOpnd, instrBr->m_func);
            instrBr->InsertBefore(instrNew);
            instrNew->SetByteCodeOffset(instrBr);
            instrNew->GetDst()->AsRegOpnd()->m_fgPeepTmp = true;
            instrNew = IR::Instr::New(Js::OpCode::Ld_A, instrLd->GetDst(), falseOpnd, instrBr->m_func);
            instrBr->InsertBefore(instrNew);
            instrNew->SetByteCodeOffset(instrBr);
            instrNew->GetDst()->AsRegOpnd()->m_fgPeepTmp = true;

            instrNew = IR::Instr::New(Js::OpCode::Ld_A, instrLd->GetSrc1(), trueOpnd, instrLd->m_func);
            instrLd->InsertBefore(instrNew);
            instrNew->SetByteCodeOffset(instrLd);
            instrLd->ReplaceSrc1(trueOpnd);
            instrNew->GetDst()->AsRegOpnd()->m_fgPeepTmp = true;

            if (instrLd2)
            {
                instrLd2->ReplaceSrc1(trueOpnd);
                instrNew = IR::Instr::New(Js::OpCode::Ld_A, instrLd2->GetDst(), falseOpnd, instrBr->m_func);
                instrBr->InsertBefore(instrNew);
                instrNew->SetByteCodeOffset(instrBr);
                instrNew->GetDst()->AsRegOpnd()->m_fgPeepTmp = true;
            }
        }
    }

    // Fix InlineeEnd
    if (inlineeEndInstr)
    {
        this->InsertInlineeOnFLowEdge(instrBr->AsBranchInstr(), inlineeEndInstr, instrByteCode , origBrFunc, origBrByteCodeOffset, origBranchSrcOpndIsJITOpt, origBranchSrcSymId);
    }

    if (instr->GetDst()->AsRegOpnd()->m_sym->HasByteCodeRegSlot())
    {
        Assert(!instrBr->AsBranchInstr()->HasByteCodeReg());
        StackSym *dstSym = instr->GetDst()->AsRegOpnd()->m_sym;
        instrBr->AsBranchInstr()->SetByteCodeReg(dstSym->GetByteCodeRegSlot());
    }

    brSrc = brSrc->Copy(this->func);
    // We need brSrc later, but instr->Remove() might delete it...
    IR::AutoReuseOpnd brSrcAutoCopy(brSrc, this->func, true);
    instr->Remove();

    //
    // Try optimizing through a second branch.
    // Peep:
    //
    //      t2 = True;
    //      BrTrue  $L1
    //      ...
    //   L1:
    //      t1 = Ld_A t2
    //      BrTrue  $L2
    //
    // Into:
    //      t2 = True;
    //      t1 = True;
    //      BrTrue  $L2 <---
    //      ...
    //   L1:
    //      t1 = Ld_A t2
    //      BrTrue  $L2
    //
    // This cleanup helps expose second level Cm peeps.

    IR::Instr *instrLd3 = instrBr->AsBranchInstr()->GetTarget()->GetNextRealInstrOrLabel();

    // Skip over branch to branch
    while (instrLd3->m_opcode == Js::OpCode::Br)
    {
        instrLd3 = instrLd3->AsBranchInstr()->GetTarget()->GetNextRealInstrOrLabel();
    }

    // Find Ld_A
    if (instrLd3->m_opcode != Js::OpCode::Ld_A)
    {
        return instrBr;
    }

    IR::Instr *instrBr2 = instrLd3->GetNextRealInstrOrLabel();
    IR::Instr *inlineeEndInstr2 = nullptr;

    // InlineeEnd?
    // REVIEW: Can we handle 2 inlineeEnds?
    if (instrBr2->m_opcode == Js::OpCode::InlineeEnd && !inlineeEndInstr)
    {
        inlineeEndInstr2 = instrBr2;
        instrBr2 = instrBr2->GetNextRealInstrOrLabel();
    }

    // Find branch
    bool brIsTrue2;
    if (instrBr2->m_opcode == Js::OpCode::BrTrue_A)
    {
        brIsTrue2 = true;
    }
    else if (instrBr2->m_opcode == Js::OpCode::BrFalse_A)
    {
        brIsTrue2 = false;
    }
    else
    {
        return nullptr;
    }

    // Make sure Ld_A operates on the right tmps.
    if (!instrLd3->GetDst()->IsEqual(instrBr2->GetSrc1()) || !brSrc->IsEqual(instrLd3->GetSrc1()))
    {
        return nullptr;
    }

    if (instrLd3->GetDst()->IsEqual(instrBr->GetSrc1()) || instrLd3->GetDst()->IsEqual(instrBr->GetSrc2()))
    {
        return nullptr;
    }

    // Make sure that the reg we're assigning to is not live in the intervening instructions (if this is a forward branch).
    if (instrLd3->GetByteCodeOffset() > instrBr->GetByteCodeOffset())
    {
        StackSym *symLd3 = instrLd3->GetDst()->AsRegOpnd()->m_sym;
        if (IR::Instr::HasSymUseInRange(symLd3, instrBr->m_next, instrLd3))
        {
            return nullptr;
        }
    }

    //
    // We have a match!
    //

    if(inlineeEndInstr2)
    {
        origBrFunc = instrBr2->m_func;
        origBrByteCodeOffset = instrBr2->GetByteCodeOffset();
        origBranchSrcSymId = instrBr2->GetSrc1()->GetStackSym()->m_id;
    }

    // Fix Ld_A
    if (brIsTrue)
    {
        instrNew = IR::Instr::New(Js::OpCode::Ld_A, instrLd3->GetDst(), trueOpnd, instrBr->m_func);
        instrBr->InsertBefore(instrNew);
        instrNew->SetByteCodeOffset(instrBr);
        instrNew->GetDst()->AsRegOpnd()->m_fgPeepTmp = true;
    }
    else
    {
        instrNew = IR::Instr::New(Js::OpCode::Ld_A, instrLd3->GetDst(), falseOpnd, instrBr->m_func);
        instrBr->InsertBefore(instrNew);
        instrNew->SetByteCodeOffset(instrBr);
        instrNew->GetDst()->AsRegOpnd()->m_fgPeepTmp = true;
    }

    IR::LabelInstr *brTarget2;

    // Retarget branch
    if (brIsTrue2 == brIsTrue)
    {
        brTarget2 = instrBr2->AsBranchInstr()->GetTarget();
    }
    else
    {
        brTarget2 = IR::LabelInstr::New(Js::OpCode::Label, instrBr2->m_func);
        brTarget2->SetByteCodeOffset(instrBr2->m_next);
        instrBr2->InsertAfter(brTarget2);
    }

    instrBr->AsBranchInstr()->SetTarget(brTarget2);

    // InlineeEnd?
    if (inlineeEndInstr2)
    {
        this->InsertInlineeOnFLowEdge(instrBr->AsBranchInstr(), inlineeEndInstr2, instrByteCode, origBrFunc, origBrByteCodeOffset, origBranchSrcOpndIsJITOpt, origBranchSrcSymId);
    }

    return instrBr;
}